

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_obj_motion.cxx
# Opt level: O1

void __thiscall
xray_re::xr_obj_motion::evaluate(xr_obj_motion *this,float time,fvector3 *t,fvector3 *r)

{
  float fVar1;
  
  fVar1 = xr_envelope::evaluate(this->m_envelopes[0],time);
  (t->field_0).field_0.x = fVar1;
  fVar1 = xr_envelope::evaluate(this->m_envelopes[1],time);
  (t->field_0).field_0.y = fVar1;
  fVar1 = xr_envelope::evaluate(this->m_envelopes[2],time);
  (t->field_0).field_0.z = fVar1;
  fVar1 = xr_envelope::evaluate(this->m_envelopes[4],time);
  (r->field_0).field_0.x = fVar1;
  fVar1 = xr_envelope::evaluate(this->m_envelopes[3],time);
  (r->field_0).field_0.y = fVar1;
  fVar1 = xr_envelope::evaluate(this->m_envelopes[5],time);
  (r->field_0).field_0.z = fVar1;
  return;
}

Assistant:

void xr_obj_motion::evaluate(float time, fvector3& t, fvector3& r) const
{
	t.x = m_envelopes[0]->evaluate(time);
	t.y = m_envelopes[1]->evaluate(time);
	t.z = m_envelopes[2]->evaluate(time);
	r.x = m_envelopes[4]->evaluate(time);
	r.y = m_envelopes[3]->evaluate(time);
	r.z = m_envelopes[5]->evaluate(time);
}